

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall
QComboBoxPrivateContainer::setItemView(QComboBoxPrivateContainer *this,QAbstractItemView *itemView)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QWidget *pQVar4;
  QStyle *pQVar5;
  undefined8 in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  bool usePopup;
  QStyleOptionComboBox opt;
  Policy in_stack_fffffffffffffe08;
  SelectionMode in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  undefined4 uVar6;
  QWidget *in_stack_fffffffffffffe18;
  ScrollBarPolicy policy;
  QFlagsStorage<QAbstractItemView::EditTrigger> actions;
  QAbstractScrollArea *in_stack_fffffffffffffe20;
  Connection *pCVar7;
  QComboBoxPrivateContainer *in_stack_fffffffffffffe28;
  code *pcVar8;
  QWidget *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  offset_in_QComboBoxPrivateContainer_to_subr in_stack_fffffffffffffe40;
  offset_in_QObject_to_subr in_stack_fffffffffffffe50;
  QBoxLayout *this_00;
  ContextType *in_stack_fffffffffffffe58;
  code *in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe70;
  QWidget *in_stack_fffffffffffffe78;
  offset_in_QAbstractSlider_to_subr in_stack_fffffffffffffe80;
  code *signal;
  ConnectionType in_stack_fffffffffffffea0;
  Connection local_d8;
  code *local_d0;
  undefined8 local_c8;
  Connection local_c0;
  code *local_b8;
  undefined8 local_b0;
  Connection local_a8;
  undefined1 local_9c [4];
  undefined1 local_98 [144];
  long local_8;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDI + 0x50) != 0) {
    QObject::removeEventFilter(*(QObject **)(in_RDI + 0x50));
    pQVar4 = QAbstractScrollArea::viewport
                       ((QAbstractScrollArea *)
                        CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    QObject::removeEventFilter(&pQVar4->super_QObject);
    QAbstractScrollArea::verticalScrollBar
              ((QAbstractScrollArea *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10))
    ;
    in_stack_fffffffffffffe60 = updateScrollers;
    QObject::disconnect<void(QAbstractSlider::*)(int),void(QComboBoxPrivateContainer::*)()>
              ((Object *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe50,
               (Object *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
               in_stack_fffffffffffffe40);
    QAbstractScrollArea::verticalScrollBar
              ((QAbstractScrollArea *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10))
    ;
    QObject::disconnect<void(QAbstractSlider::*)(int,int),void(QComboBoxPrivateContainer::*)()>
              ((Object *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe50,
               (Object *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
               in_stack_fffffffffffffe40);
    QObject::disconnect<void(QObject::*)(QObject*),void(QComboBoxPrivateContainer::*)()>
              (&in_stack_fffffffffffffe18->super_QObject,in_stack_fffffffffffffe50,
               (Object *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
               in_stack_fffffffffffffe40);
    bVar1 = QWidget::isAncestorOf
                      (in_stack_fffffffffffffe18,
                       (QWidget *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    if ((bVar1) &&
       (in_stack_fffffffffffffe58 = *(ContextType **)(in_RDI + 0x50),
       in_stack_fffffffffffffe58 != (ContextType *)0x0)) {
      (**(code **)(*(long *)&(in_stack_fffffffffffffe58->super_QFrame).super_QWidget + 0x20))();
    }
    *(undefined8 *)(in_RDI + 0x50) = 0;
  }
  policy = (ScrollBarPolicy)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  *(undefined8 *)(in_RDI + 0x50) = in_RSI;
  QWidget::setParent(in_stack_fffffffffffffe30,(QWidget *)in_stack_fffffffffffffe28);
  QWidget::setAttribute
            (in_stack_fffffffffffffe78,(WidgetAttribute)((ulong)in_stack_fffffffffffffe70 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffe70 >> 0x18,0));
  QWidget::layout((QWidget *)0x533991);
  pQVar4 = (QWidget *)qobject_cast<QBoxLayout*>((QObject *)0x533999);
  iVar3 = 0;
  if (*(long *)(in_RDI + 0x58) != 0) {
    iVar3 = 2;
  }
  this_00 = *(QBoxLayout **)(in_RDI + 0x50);
  memset(local_9c,0,4);
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x5339e6);
  QBoxLayout::insertWidget
            (this_00,iVar3,pQVar4,iVar2,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
             SUB84((ulong)in_stack_fffffffffffffe58 >> 0x20,0));
  QWidget::setSizePolicy
            ((QWidget *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
             in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08);
  QObject::installEventFilter(*(QObject **)(in_RDI + 0x50));
  pQVar4 = QAbstractScrollArea::viewport
                     ((QAbstractScrollArea *)
                      CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  QObject::installEventFilter(&pQVar4->super_QObject);
  QAbstractScrollArea::setHorizontalScrollBarPolicy(in_stack_fffffffffffffe20,policy);
  memset(local_98,0xaa,0x90);
  comboStyleOption(in_stack_fffffffffffffe28);
  pQVar5 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  iVar2 = (**(code **)(*(long *)pQVar5 + 0xf0))
                    (pQVar5,0x19,local_98,*(undefined8 *)(in_RDI + 0x48),0);
  if (iVar2 != 0) {
    QAbstractScrollArea::setVerticalScrollBarPolicy(in_stack_fffffffffffffe20,policy);
  }
  pQVar5 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  iVar3 = (**(code **)(*(long *)pQVar5 + 0xf0))
                    (pQVar5,0x13,local_98,*(undefined8 *)(in_RDI + 0x48),0);
  if ((iVar3 != 0) || (iVar2 != 0)) {
    QWidget::setMouseTracking
              ((QWidget *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
               SUB41(in_stack_fffffffffffffe0c >> 0x18,0));
  }
  QAbstractItemView::setSelectionMode
            ((QAbstractItemView *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
             in_stack_fffffffffffffe0c);
  uVar6 = 0;
  QFrame::setFrameStyle(&in_stack_fffffffffffffe20->super_QFrame,policy);
  QFrame::setLineWidth
            ((QFrame *)CONCAT44(uVar6,in_stack_fffffffffffffe10),in_stack_fffffffffffffe0c);
  actions.i = (Int)((ulong)*(undefined8 *)(in_RDI + 0x50) >> 0x20);
  QFlags<QAbstractItemView::EditTrigger>::QFlags
            ((QFlags<QAbstractItemView::EditTrigger> *)CONCAT44(uVar6,in_stack_fffffffffffffe10),
             in_stack_fffffffffffffe0c);
  QAbstractItemView::setEditTriggers
            ((QAbstractItemView *)CONCAT44(uVar6,in_stack_fffffffffffffe10),(EditTriggers)actions.i)
  ;
  QAbstractScrollArea::verticalScrollBar
            ((QAbstractScrollArea *)CONCAT44(uVar6,in_stack_fffffffffffffe10));
  pcVar8 = updateScrollers;
  local_b8 = updateScrollers;
  local_b0 = 0;
  pCVar7 = &local_a8;
  QObject::connect<void(QAbstractSlider::*)(int),void(QComboBoxPrivateContainer::*)()>
            ((Object *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe80,in_stack_fffffffffffffe58
             ,(offset_in_QComboBoxPrivateContainer_to_subr *)this_00,in_stack_fffffffffffffea0);
  QMetaObject::Connection::~Connection(pCVar7);
  QAbstractScrollArea::verticalScrollBar
            ((QAbstractScrollArea *)CONCAT44(uVar6,in_stack_fffffffffffffe10));
  local_c8 = 0;
  signal = QAbstractSlider::rangeChanged;
  pCVar7 = &local_c0;
  local_d0 = pcVar8;
  QObject::connect<void(QAbstractSlider::*)(int,int),void(QComboBoxPrivateContainer::*)()>
            ((Object *)in_stack_fffffffffffffe60,
             (offset_in_QAbstractSlider_to_subr)QAbstractSlider::rangeChanged,
             in_stack_fffffffffffffe58,(offset_in_QComboBoxPrivateContainer_to_subr *)this_00,
             in_stack_fffffffffffffea0);
  QMetaObject::Connection::~Connection(pCVar7);
  pCVar7 = &local_d8;
  QObject::connect<void(QObject::*)(QObject*),void(QComboBoxPrivateContainer::*)()>
            ((Object *)in_stack_fffffffffffffe60,(offset_in_QObject_to_subr)signal,
             in_stack_fffffffffffffe58,(offset_in_QComboBoxPrivateContainer_to_subr *)this_00,
             in_stack_fffffffffffffea0);
  QMetaObject::Connection::~Connection(pCVar7);
  QStyleOptionComboBox::~QStyleOptionComboBox
            ((QStyleOptionComboBox *)CONCAT44(uVar6,in_stack_fffffffffffffe10));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBoxPrivateContainer::setItemView(QAbstractItemView *itemView)
{
    Q_ASSERT(itemView);

    // clean up old one
    if (view) {
        view->removeEventFilter(this);
        view->viewport()->removeEventFilter(this);
#if QT_CONFIG(scrollbar)
        disconnect(view->verticalScrollBar(), &QScrollBar::valueChanged,
                   this, &QComboBoxPrivateContainer::updateScrollers);
        disconnect(view->verticalScrollBar(), &QScrollBar::rangeChanged,
                   this, &QComboBoxPrivateContainer::updateScrollers);
#endif
        disconnect(view, &QAbstractItemView::destroyed,
                   this, &QComboBoxPrivateContainer::viewDestroyed);

        if (isAncestorOf(view))
            delete view;
        view = nullptr;
    }

    // setup the item view
    view = itemView;
    view->setParent(this);
    view->setAttribute(Qt::WA_MacShowFocusRect, false);
    qobject_cast<QBoxLayout*>(layout())->insertWidget(top ? 2 : 0, view);
    view->setSizePolicy(QSizePolicy::Ignored, QSizePolicy::Ignored);
    view->installEventFilter(this);
    view->viewport()->installEventFilter(this);
    view->setHorizontalScrollBarPolicy(Qt::ScrollBarAlwaysOff);
    QStyleOptionComboBox opt = comboStyleOption();
    const bool usePopup = combo->style()->styleHint(QStyle::SH_ComboBox_Popup, &opt, combo);
#if QT_CONFIG(scrollbar)
    if (usePopup)
        view->setVerticalScrollBarPolicy(Qt::ScrollBarAlwaysOff);
#endif
    if (combo->style()->styleHint(QStyle::SH_ComboBox_ListMouseTracking, &opt, combo) ||
        usePopup) {
        view->setMouseTracking(true);
    }
    view->setSelectionMode(QAbstractItemView::SingleSelection);
    view->setFrameStyle(QFrame::NoFrame);
    view->setLineWidth(0);
    view->setEditTriggers(QAbstractItemView::NoEditTriggers);
#if QT_CONFIG(scrollbar)
    connect(view->verticalScrollBar(), &QScrollBar::valueChanged,
            this, &QComboBoxPrivateContainer::updateScrollers);
    connect(view->verticalScrollBar(), &QScrollBar::rangeChanged,
            this, &QComboBoxPrivateContainer::updateScrollers);
#endif
    connect(view, &QAbstractItemView::destroyed,
            this, &QComboBoxPrivateContainer::viewDestroyed);
}